

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O0

OutStream * __thiscall
r_comp::OutStream::push<char[3]>(OutStream *this,char (*t) [3],uint16_t code_index)

{
  fpos<__mbstate_t> t_00;
  size_t sVar1;
  unsigned_short *puVar2;
  OutStream *pOVar3;
  uint16_t code_index_local;
  char (*t_local) [3];
  OutStream *this_local;
  
  t_00 = (fpos<__mbstate_t>)std::ostream::tellp();
  r_code::vector<std::fpos<__mbstate_t>_>::push_back(&this->positions,t_00);
  sVar1 = r_code::vector<std::fpos<__mbstate_t>_>::size(&this->positions);
  puVar2 = r_code::vector<unsigned_short>::operator[]
                     (&this->code_indexes_to_stream_indexes,(ulong)code_index);
  *puVar2 = (short)sVar1 - 1;
  pOVar3 = operator<<(this,t);
  return pOVar3;
}

Assistant:

OutStream &push(const T &t, uint16_t code_index)
    {
        positions.push_back(stream->tellp());
        code_indexes_to_stream_indexes[code_index] = positions.size() - 1;
        return *this << t;
    }